

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O0

int __thiscall Fl_Table::handle(Fl_Table *this,int event)

{
  TableContext context_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Fl_When FVar6;
  Fl_Table *pFVar7;
  Fl_Widget *pFVar8;
  Fl_Callback_p pFVar9;
  ResizeFlag local_90;
  TableContext local_8c;
  int is_col;
  int is_row;
  int new_h;
  int offset_1;
  int new_w;
  int offset;
  Fl_Widget *_focus;
  int _event_key;
  int _event_y;
  int _event_x;
  int _event_clicks;
  int _event_button;
  TableContext context;
  ResizeFlag resizeflag;
  int C;
  int R;
  int ret;
  int event_local;
  Fl_Table *this_local;
  
  R = event;
  _ret = this;
  C = Fl_Group::handle(&this->super_Fl_Group,event);
  context_00 = cursor2rowcol(this,(int *)&resizeflag,(int *)&context,(ResizeFlag *)&_event_button);
  if (C != 0) {
    iVar1 = Fl::event_inside((Fl_Widget *)this->hscrollbar);
    if ((iVar1 != 0) || (iVar1 = Fl::event_inside((Fl_Widget *)this->vscrollbar), iVar1 != 0)) {
      return 1;
    }
    if (((context_00 != CONTEXT_ROW_HEADER) && (context_00 != CONTEXT_COL_HEADER)) &&
       (pFVar7 = (Fl_Table *)Fl::focus(), pFVar7 != this)) {
      pFVar8 = Fl::focus();
      iVar1 = Fl_Widget::contains((Fl_Widget *)this,pFVar8);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  iVar1 = Fl::event_button();
  iVar2 = Fl::event_clicks();
  iVar3 = Fl::event_x();
  iVar4 = Fl::event_y();
  iVar5 = Fl::event_key();
  pFVar7 = (Fl_Table *)Fl::focus();
  switch(R) {
  case 1:
    if ((iVar1 == 1) && (iVar2 == 0)) {
      if (pFVar7 == this) {
        Fl_Widget::take_focus((Fl_Widget *)this);
        do_callback(this,CONTEXT_TABLE,-1,-1);
        C = 1;
      }
      damage_zone(this,this->current_row,this->current_col,this->select_row,this->select_col,
                  resizeflag,context);
      if (context_00 == CONTEXT_CELL) {
        this->select_row = resizeflag;
        this->current_row = resizeflag;
        this->select_col = context;
        this->current_col = context;
        this->_selecting = 0x10;
      }
      else if (_event_button == 0) {
        this->select_row = -1;
        this->current_row = -1;
        this->select_col = -1;
        this->current_col = -1;
      }
    }
    pFVar9 = Fl_Widget::callback((Fl_Widget *)this);
    if ((pFVar9 != (Fl_Callback_p)0x0) && (_event_button == 0)) {
      do_callback(this,context_00,resizeflag,context);
    }
    switch(context_00) {
    case CONTEXT_NONE:
      if (iVar1 == 1) {
        iVar1 = Fl_Widget::x((Fl_Widget *)this);
        iVar2 = row_header_width(this);
        if (iVar3 < iVar1 + iVar2) {
          this->current_col = 0;
          iVar1 = cols(this);
          this->select_col = iVar1 + -1;
          this->current_row = 0;
          iVar1 = rows(this);
          this->select_row = iVar1 + -1;
          damage_zone(this,this->current_row,this->current_col,this->select_row,this->select_col,0,0
                     );
          C = 1;
        }
      }
      break;
    default:
      C = 0;
      break;
    case CONTEXT_ROW_HEADER:
      if (iVar1 == 1) {
        if (_event_button == 0) {
          pFVar7 = (Fl_Table *)Fl::focus();
          if (pFVar7 != this) {
            pFVar8 = Fl::focus();
            iVar1 = Fl_Widget::contains((Fl_Widget *)this,pFVar8);
            if (iVar1 != 0) {
              return 0;
            }
          }
          this->select_row = resizeflag;
          this->current_row = resizeflag;
          this->current_col = 0;
          iVar1 = cols(this);
          this->select_col = iVar1 + -1;
          this->_selecting = 4;
          damage_zone(this,this->current_row,this->current_col,this->select_row,this->select_col,0,0
                     );
        }
        else {
          if ((_event_button & 3U) == 0) {
            local_90 = resizeflag;
          }
          else {
            local_90 = resizeflag - RESIZE_COL_LEFT;
          }
          this->_resizing_row = local_90;
          this->_resizing_col = -1;
          this->_dragging_y = iVar4;
        }
        C = 1;
      }
      break;
    case CONTEXT_COL_HEADER:
      if (iVar1 == 1) {
        if (_event_button == 0) {
          pFVar7 = (Fl_Table *)Fl::focus();
          if (pFVar7 != this) {
            pFVar8 = Fl::focus();
            iVar1 = Fl_Widget::contains((Fl_Widget *)this,pFVar8);
            if (iVar1 != 0) {
              return 0;
            }
          }
          this->select_col = context;
          this->current_col = context;
          this->current_row = 0;
          iVar1 = rows(this);
          this->select_row = iVar1 + -1;
          this->_selecting = 8;
          damage_zone(this,this->current_row,this->current_col,this->select_row,this->select_col,0,0
                     );
        }
        else {
          if ((_event_button & 1U) == 0) {
            local_8c = context;
          }
          else {
            local_8c = context - CONTEXT_STARTPAGE;
          }
          this->_resizing_col = local_8c;
          this->_resizing_row = -1;
          this->_dragging_x = iVar3;
        }
        C = 1;
      }
      break;
    case CONTEXT_CELL:
      C = 1;
    }
    this->_last_row = resizeflag;
    break;
  case 2:
    _stop_auto_drag(this);
    if (((((context_00 == CONTEXT_ROW_HEADER) || (context_00 == CONTEXT_COL_HEADER)) ||
         ((context_00 == CONTEXT_CELL || (context_00 == CONTEXT_TABLE)))) &&
        ((this->_resizing_col == -1 && (this->_resizing_row == -1)))) &&
       ((pFVar9 = Fl_Widget::callback((Fl_Widget *)this), pFVar9 != (Fl_Callback_p)0x0 &&
        ((FVar6 = Fl_Widget::when((Fl_Widget *)this), (FVar6 & FL_WHEN_RELEASE) != FL_WHEN_NEVER &&
         (this->_last_row == resizeflag)))))) {
      do_callback(this,context_00,resizeflag,context);
    }
    if (iVar1 == 1) {
      change_cursor(this,FL_CURSOR_DEFAULT);
      this->_resizing_col = -1;
      this->_resizing_row = -1;
      C = 1;
    }
    break;
  case 3:
    if (C == 0) {
      Fl_Widget::take_focus((Fl_Widget *)this);
    }
    C = 1;
  case 4:
    if (_event_button != 0) {
      C = 1;
    }
    if (R == 4) {
      _stop_auto_drag(this);
      change_cursor(this,FL_CURSOR_DEFAULT);
    }
    break;
  case 5:
    if (this->_auto_drag == 1) {
      C = 1;
    }
    else {
      if (this->_resizing_col < 0) {
        if (this->_resizing_row < 0) {
          if (((iVar1 == 1) && (this->_selecting == 0x10)) && (context_00 == CONTEXT_CELL)) {
            if (iVar2 != 0) {
              return C;
            }
            if ((this->select_row != resizeflag) || (this->select_col != context)) {
              damage_zone(this,this->current_row,this->current_col,this->select_row,this->select_col
                          ,resizeflag,context);
            }
            this->select_row = resizeflag;
            this->select_col = context;
            C = 1;
          }
          else if (((iVar1 == 1) && (this->_selecting == 4)) &&
                  ((context_00 & (CONTEXT_CELL|CONTEXT_COL_HEADER|CONTEXT_ROW_HEADER)) !=
                   CONTEXT_NONE)) {
            if (this->select_row != resizeflag) {
              damage_zone(this,this->current_row,this->current_col,this->select_row,this->select_col
                          ,resizeflag,context);
            }
            this->select_row = resizeflag;
            C = 1;
          }
          else if (((iVar1 == 1) && (this->_selecting == 8)) &&
                  ((context_00 & (CONTEXT_CELL|CONTEXT_COL_HEADER|CONTEXT_ROW_HEADER)) !=
                   CONTEXT_NONE)) {
            if (this->select_col != context) {
              damage_zone(this,this->current_row,this->current_col,this->select_row,this->select_col
                          ,resizeflag,context);
            }
            this->select_col = context;
            C = 1;
          }
        }
        else {
          iVar1 = this->_dragging_y;
          iVar2 = row_height(this,this->_resizing_row);
          is_col = iVar2 - (iVar1 - iVar4);
          if (is_col < this->_row_resize_min) {
            is_col = this->_row_resize_min;
          }
          row_height(this,this->_resizing_row,is_col);
          this->_dragging_y = iVar4;
          table_resized(this);
          Fl_Widget::redraw((Fl_Widget *)this);
          change_cursor(this,FL_CURSOR_NS);
          C = 1;
          pFVar9 = Fl_Widget::callback((Fl_Widget *)this);
          if ((pFVar9 != (Fl_Callback_p)0x0) &&
             (FVar6 = Fl_Widget::when((Fl_Widget *)this), (FVar6 & FL_WHEN_CHANGED) != FL_WHEN_NEVER
             )) {
            do_callback(this,CONTEXT_RC_RESIZE,resizeflag,context);
          }
        }
      }
      else {
        iVar1 = this->_dragging_x;
        iVar2 = col_width(this,this->_resizing_col);
        new_h = iVar2 - (iVar1 - iVar3);
        if (new_h < this->_col_resize_min) {
          new_h = this->_col_resize_min;
        }
        col_width(this,this->_resizing_col,new_h);
        this->_dragging_x = iVar3;
        table_resized(this);
        Fl_Widget::redraw((Fl_Widget *)this);
        change_cursor(this,FL_CURSOR_WE);
        C = 1;
        pFVar9 = Fl_Widget::callback((Fl_Widget *)this);
        if ((pFVar9 != (Fl_Callback_p)0x0) &&
           (FVar6 = Fl_Widget::when((Fl_Widget *)this), (FVar6 & FL_WHEN_CHANGED) != FL_WHEN_NEVER))
        {
          do_callback(this,CONTEXT_RC_RESIZE,resizeflag,context);
        }
      }
      if (((this->_resizing_row < 0) && (this->_resizing_col < 0)) && (this->_auto_drag == 0)) {
        iVar1 = Fl_Widget::x((Fl_Widget *)this);
        iVar2 = Fl_Widget::w((Fl_Widget *)this);
        if (iVar3 <= iVar1 + iVar2 + -0x14) {
          iVar1 = Fl_Widget::x((Fl_Widget *)this);
          iVar2 = row_header_width(this);
          if (iVar1 + iVar2 <= iVar3) {
            iVar1 = Fl_Widget::y((Fl_Widget *)this);
            iVar2 = Fl_Widget::h((Fl_Widget *)this);
            if (iVar4 <= iVar1 + iVar2 + -0x14) {
              iVar1 = Fl_Widget::y((Fl_Widget *)this);
              iVar2 = col_header_height(this);
              if (iVar1 + iVar2 <= iVar4) {
                return C;
              }
            }
          }
        }
        _start_auto_drag(this);
      }
    }
    break;
  case 6:
    Fl::focus((Fl_Widget *)this);
  case 7:
    _stop_auto_drag(this);
    C = 1;
    break;
  case 8:
    C = 0;
    iVar1 = this->select_row;
    iVar2 = this->select_col;
    switch(iVar5) {
    case 0xff09:
      break;
    case 0xff50:
      C = move_cursor(this,0,-1000000);
      break;
    case 0xff51:
      C = move_cursor(this,0,-1);
      break;
    case 0xff52:
      C = move_cursor(this,-1,0);
      break;
    case 0xff53:
      C = move_cursor(this,0,1);
      break;
    case 0xff54:
      C = move_cursor(this,1,0);
      break;
    case 0xff55:
      C = move_cursor(this,-((this->botrow - this->toprow) + -1),0);
      break;
    case 0xff56:
      C = move_cursor(this,(this->botrow - this->toprow) + -1,0);
      break;
    case 0xff57:
      C = move_cursor(this,0,1000000);
    }
    if ((C != 0) && (pFVar7 = (Fl_Table *)Fl::focus(), pFVar7 != this)) {
      do_callback(this,CONTEXT_TABLE,-1,-1);
      Fl_Widget::take_focus((Fl_Widget *)this);
    }
    pFVar9 = Fl_Widget::callback((Fl_Widget *)this);
    if ((pFVar9 != (Fl_Callback_p)0x0) &&
       ((((C == 0 &&
          (FVar6 = Fl_Widget::when((Fl_Widget *)this),
          (FVar6 & FL_WHEN_NOT_CHANGED) != FL_WHEN_NEVER)) || (iVar1 != this->select_row)) ||
        (iVar2 != this->select_col)))) {
      do_callback(this,CONTEXT_CELL,this->select_row,this->select_col);
      C = 1;
    }
    break;
  default:
    change_cursor(this,FL_CURSOR_DEFAULT);
    break;
  case 0xb:
    if ((context_00 == CONTEXT_COL_HEADER) && (_event_button != 0)) {
      change_cursor(this,FL_CURSOR_WE);
    }
    else if ((context_00 == CONTEXT_ROW_HEADER) && (_event_button != 0)) {
      change_cursor(this,FL_CURSOR_NS);
    }
    else {
      change_cursor(this,FL_CURSOR_DEFAULT);
    }
    C = 1;
  }
  return C;
}

Assistant:

int Fl_Table::handle(int event) {
  PRINTEVENT;
  int ret = Fl_Group::handle(event);	// let FLTK group handle events first
  // Which row/column are we over?
  int R, C;  				// row/column being worked on
  ResizeFlag resizeflag;		// which resizing area are we over? (0=none)
  TableContext context = cursor2rowcol(R, C, resizeflag);
  if (ret) {
    if (Fl::event_inside(hscrollbar) || Fl::event_inside(vscrollbar)) return 1;
    if ( context != CONTEXT_ROW_HEADER &&		// mouse not in row header (STR#2742)
         context != CONTEXT_COL_HEADER &&		// mouse not in col header (STR#2742)
         Fl::focus() != this && 			// we don't have focus?
         contains(Fl::focus())) {			// focus is a child?
      return 1;
    }
  }
  // Make snapshots of realtime event states *before* we service user's cb,
  // which may do things like post popup menus that return with unexpected button states.
  int _event_button = Fl::event_button();
  int _event_clicks = Fl::event_clicks();
  int _event_x      = Fl::event_x();
  int _event_y      = Fl::event_y();
  int _event_key    = Fl::event_key();
#if FLTK_ABI_VERSION >= 10303
  int _event_state  = Fl::event_state();
#endif
  Fl_Widget *_focus = Fl::focus();
  switch ( event ) {
    case FL_PUSH:
      // Single left-click on table? do user's callback with CONTEXT_TABLE
      if (_event_button == 1 && !_event_clicks) {
        if (_focus == this) {
          take_focus();
          do_callback(CONTEXT_TABLE, -1, -1);
          ret = 1;
        }
        damage_zone(current_row, current_col, select_row, select_col, R, C);
        if (context == CONTEXT_CELL) {
          current_row = select_row = R;
          current_col = select_col = C;
          _selecting = CONTEXT_CELL;
        } else {
	  // Clear selection if not resizing row/col
	  if ( !resizeflag ) {
            current_row = select_row = -1;
            current_col = select_col = -1;
	  }
        }
      }
      // A click on table with user's callback defined?
      //     Need this for eg. right click to pop up a menu
      //
      if ( Fl_Widget::callback() &&		// callback defined?
          resizeflag == RESIZE_NONE ) {		// not resizing?
        do_callback(context, R, C);		// do callback with context (cell, header, etc)
      }
      // Handle selection if handling a left-click
      //    Use snapshot of _event_button we made before servicing user's cb's
      //    to avoid checking realtime state of buttons which may have changed
      //    during the user's callbacks.
      //
      switch ( context ) {
        case CONTEXT_CELL:
          // FL_PUSH on a cell?
          ret = 1;				// express interest in FL_RELEASE
          break;
          
        case CONTEXT_NONE:
          // FL_PUSH on table corner?
          if ( _event_button == 1 && _event_x < x() + row_header_width()) {
            current_col = 0;
            select_col = cols() - 1;
            current_row = 0;
            select_row = rows() - 1;				
            damage_zone(current_row, current_col, select_row, select_col);
            ret = 1;
          }
          break;
          
        case CONTEXT_COL_HEADER:
          // FL_PUSH on a column header?
          if ( _event_button == 1) {
            // Resizing? Handle it
            if ( resizeflag ) {
              // Start resize if left click on column border.
              //    "ret=1" ensures we get drag events from now on.
              //    (C-1) is used if mouse is over the left hand side 
              //    of cell, so we resize the next column on the left.
              //
              _resizing_col = ( resizeflag & RESIZE_COL_LEFT ) ? C-1 : C; 
              _resizing_row = -1;
              _dragging_x = _event_x;
              ret = 1;
            } else {
              // Not resizing? Select the column
	      if ( Fl::focus() != this && contains(Fl::focus()) ) return 0;	// STR #3018 - item 1
              current_col = select_col = C;
              current_row = 0;
              select_row = rows() - 1;
              _selecting = CONTEXT_COL_HEADER;
              damage_zone(current_row, current_col, select_row, select_col);
              ret = 1;
            }
          }
          break;
          
        case CONTEXT_ROW_HEADER:
          // FL_PUSH on a row header?
          if ( _event_button == 1 ) {
            // Resizing? Handle it
            if ( resizeflag ) {
              // Start resize if left mouse clicked on row border.
              //    "ret = 1" ensures we get drag events from now on.
              //    (R-1) is used if mouse is over the top of the cell,
              //    so that we resize the row above.
              //
              _resizing_row = ( resizeflag & RESIZE_ROW_ABOVE ) ? R-1 : R; 
              _resizing_col = -1;
              _dragging_y = _event_y; 
              ret = 1;
            } else {
              // Not resizing? Select the row
	      if ( Fl::focus() != this && contains(Fl::focus()) ) return 0;	// STR #3018 - item 1
              current_row = select_row = R;
              current_col = 0;
              select_col = cols() - 1;
              _selecting = CONTEXT_ROW_HEADER;
              damage_zone(current_row, current_col, select_row, select_col);
              ret = 1;
            }
          }
          break;
          
        default:
          ret = 0;		// express disinterest
          break;
      }
      _last_row = R;
      break;
      
    case FL_DRAG:
      if (_auto_drag == 1) {
        ret = 1;
        break;
      } 
      if ( _resizing_col > -1 ) {
        // Dragging column?
        //
        //    Let user drag even /outside/ the row/col widget.
        //    Don't allow column width smaller than 1.
        //    Continue to show FL_CURSOR_WE at all times during drag.
        //
        int offset = _dragging_x - _event_x;
        int new_w = col_width(_resizing_col) - offset;
        if ( new_w < _col_resize_min ) new_w = _col_resize_min;
        col_width(_resizing_col, new_w);
        _dragging_x = _event_x;
        table_resized();
        redraw();
        change_cursor(FL_CURSOR_WE);
        ret = 1;
        if ( Fl_Widget::callback() && when() & FL_WHEN_CHANGED ) {
          do_callback(CONTEXT_RC_RESIZE, R, C);
        }
      }
      else if ( _resizing_row > -1 ) {
        // Dragging row?
        //
        //    Let user drag even /outside/ the row/col widget.
        //    Don't allow row width smaller than 1.
        //    Continue to show FL_CURSOR_NS at all times during drag.
        //
        int offset = _dragging_y - _event_y;
        int new_h = row_height(_resizing_row) - offset;
        if ( new_h < _row_resize_min ) new_h = _row_resize_min;
        row_height(_resizing_row, new_h);
        _dragging_y = _event_y;
        table_resized();
        redraw();
        change_cursor(FL_CURSOR_NS);
        ret = 1;
        if ( Fl_Widget::callback() && when() & FL_WHEN_CHANGED ) {
          do_callback(CONTEXT_RC_RESIZE, R, C);
        }
      } else {
        if (_event_button == 1 && 
            _selecting == CONTEXT_CELL &&
            context == CONTEXT_CELL) {
          // Dragging a cell selection?
	  if ( _event_clicks ) break;			// STR #3018 - item 2
          if (select_row != R || select_col != C) {
            damage_zone(current_row, current_col, select_row, select_col, R, C);
          }
          select_row = R;
          select_col = C;
          ret = 1;
        }
        else if (_event_button == 1 && 
                 _selecting == CONTEXT_ROW_HEADER && 
                 context & (CONTEXT_ROW_HEADER|CONTEXT_COL_HEADER|CONTEXT_CELL)) {
          if (select_row != R) {
            damage_zone(current_row, current_col, select_row, select_col, R, C);
          }
          select_row = R;
          ret = 1;
        }
        else if (_event_button == 1 && 
                 _selecting == CONTEXT_COL_HEADER 
                 && context & (CONTEXT_ROW_HEADER|CONTEXT_COL_HEADER|CONTEXT_CELL)) {
          if (select_col != C) {
            damage_zone(current_row, current_col, select_row, select_col, R, C);
          }
          select_col = C;
          ret = 1;
        }
      }
      // Enable autodrag if not resizing, and mouse has moved off table edge
      if ( _resizing_row < 0 && _resizing_col < 0 && _auto_drag == 0 && 
          ( _event_x > x() + w() - 20 ||
            _event_x < x() + row_header_width() || 
            _event_y > y() + h() - 20 ||
            _event_y < y() + col_header_height()
           ) ) {
            _start_auto_drag();
          }
      break;
      
    case FL_RELEASE:
      _stop_auto_drag();
      switch ( context ) {
        case CONTEXT_ROW_HEADER:		// release on row header
        case CONTEXT_COL_HEADER:		// release on col header
        case CONTEXT_CELL:			// release on a cell
        case CONTEXT_TABLE:			// release on dead zone
          if ( _resizing_col == -1 &&		// not resizing a column
              _resizing_row == -1 &&		// not resizing a row
              Fl_Widget::callback() && 		// callback defined
              when() & FL_WHEN_RELEASE && 	// on button release
              _last_row == R ) {		// release on same row PUSHed?
            // Need this for eg. left clicking on a cell to select it
            do_callback(context, R, C);
          }
          break;
          
        default:
          break;
      }
      if ( _event_button == 1 ) {
        change_cursor(FL_CURSOR_DEFAULT);
        _resizing_col = -1;
        _resizing_row = -1;
        ret = 1;
      }
      break;
      
    case FL_MOVE:
      if ( context == CONTEXT_COL_HEADER && 		// in column header?
          resizeflag ) {				// resize + near boundary?
        change_cursor(FL_CURSOR_WE);			// show resize cursor
      }
      else if ( context == CONTEXT_ROW_HEADER && 	// in row header?
               resizeflag ) {				// resize + near boundary?
        change_cursor(FL_CURSOR_NS);			// show resize cursor
      } else {
        change_cursor(FL_CURSOR_DEFAULT);		// normal cursor
      }
      ret = 1;
      break;
      
    case FL_ENTER:		// See FLTK event docs on the FL_ENTER widget
      if (!ret) take_focus();
      ret = 1;
      //FALLTHROUGH
      
    case FL_LEAVE:		// We want to track the mouse if resizing is allowed.
      if ( resizeflag ) {
        ret = 1;
      }
      if ( event == FL_LEAVE ) {
        _stop_auto_drag();
        change_cursor(FL_CURSOR_DEFAULT);
      }
      break;
      
    case FL_FOCUS:
      Fl::focus(this);
      //FALLTHROUGH
      
    case FL_UNFOCUS:
      _stop_auto_drag();
      ret = 1;
      break;
      
    case FL_KEYBOARD: {
      ret = 0;
      int is_row = select_row;
      int is_col = select_col;
      switch(_event_key) {
        case FL_Home:
          ret = move_cursor(0, -1000000);
          break;
        case FL_End:
          ret = move_cursor(0, 1000000);
          break;
        case FL_Page_Up:
          ret = move_cursor(-(botrow - toprow - 1), 0);
          break;
        case FL_Page_Down:
          ret = move_cursor(botrow - toprow - 1 , 0);
          break;
        case FL_Left:
          ret = move_cursor(0, -1);
          break;
        case FL_Right:
          ret = move_cursor(0, 1);
          break;
        case FL_Up:
          ret = move_cursor(-1, 0);
          break;
        case FL_Down:
          ret = move_cursor(1, 0);
          break;
	case FL_Tab:
#if FLTK_ABI_VERSION >= 10303
	  if ( !tab_cell_nav() ) break;		// not navigating cells? let fltk handle it (STR#2862)
	  if ( _event_state & FL_SHIFT ) {
            ret = move_cursor(0, -1, 0);	// shift-tab -> left
	  } else {
	    ret = move_cursor(0, 1, 0);		// tab -> right
	  }
          break;
#else
          break;				// without tab_cell_nav(), Fl_Table should default to navigating widgets, not cells
#endif
      }
      if (ret && Fl::focus() != this) {
        do_callback(CONTEXT_TABLE, -1, -1);
        take_focus();
      }
      //if (!ret && Fl_Widget::callback() && when() & FL_WHEN_NOT_CHANGED  )
      if ( Fl_Widget::callback() && 
          (
           ( !ret && when() & FL_WHEN_NOT_CHANGED ) || 
           ( is_row!= select_row || is_col!= select_col ) 
           )
          ) {
        do_callback(CONTEXT_CELL, select_row, select_col); 
        //damage_zone(current_row, current_col, select_row, select_col);
        ret = 1;
      }
      break;
    }
      
    default:
      change_cursor(FL_CURSOR_DEFAULT);
      break;
  }
  return(ret);
}